

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O3

void __thiscall UEFITool::goToData(UEFITool *this)

{
  UINT8 UVar1;
  bool bVar2;
  int iVar3;
  UINT32 UVar4;
  UINT32 UVar5;
  long *plVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  QModelIndex index;
  QByteArray rdata;
  QModelIndex currentIndex;
  QModelIndex parent;
  QModelIndex local_98;
  ulong local_80;
  QByteArray local_78;
  QModelIndex local_60;
  undefined1 local_48 [16];
  long *local_38;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::currentIndex();
  if (((-1 < local_98.r) && (-1 < (long)local_98._0_8_)) &&
     (local_98.m != (QAbstractItemModel *)0x0)) {
    UVar1 = TreeModel::type(this->model,&local_98);
    if (UVar1 == 'O') {
      UVar1 = TreeModel::subtype(this->model,&local_98);
      if (UVar1 == 0x84) {
        (**(code **)(*(long *)this->model + 0x68))(local_48,this->model,&local_98);
        uVar8 = local_98.r;
        iVar3 = (**(code **)(*(long *)this->model + 0x78))(this->model,local_48);
        if ((int)uVar8 < iVar3) {
          uVar7 = uVar8;
          do {
            uVar7 = uVar7 + 1;
            bVar2 = TreeModel::hasEmptyParsingData(this->model,&local_98);
            if (!bVar2) {
              local_80 = (ulong)uVar8;
              TreeModel::parsingData(&local_78,this->model,&local_98);
              pcVar9 = local_78.d.ptr;
              UVar4 = TreeModel::offset(this->model,&local_98);
              if (pcVar9 == (char *)0x0) {
                pcVar9 = (char *)&QByteArray::_empty;
              }
              uVar8 = uVar7;
              if (*(int *)(pcVar9 + 4) == 0xffffff) {
                (**(code **)(**(long **)(this->ui + 0x130) + 0x1e8))
                          (*(long **)(this->ui + 0x130),&local_98,3);
                plVar6 = (long *)QAbstractItemView::selectionModel();
                (**(code **)(*plVar6 + 0x68))(plVar6,&local_98,0x23);
              }
              while( true ) {
                iVar3 = (**(code **)(*(long *)this->model + 0x78))(this->model,local_48);
                if (iVar3 <= (int)uVar8) break;
                (**(code **)(*local_38 + 0x60))(&local_60,local_38,uVar8,0,local_48);
                bVar2 = TreeModel::hasEmptyParsingData(this->model,&local_60);
                if (!bVar2) {
                  UVar5 = TreeModel::offset(this->model,&local_60);
                  if (UVar5 == *(int *)(pcVar9 + 4) + UVar4) {
                    local_98.m = local_60.m;
                    local_98.r = local_60.r;
                    local_98.c = local_60.c;
                    local_98.i = local_60.i;
                    break;
                  }
                }
                uVar8 = uVar8 + 1;
              }
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,8);
                }
              }
              uVar8 = (uint)local_80;
            }
            uVar8 = uVar8 + 1;
            iVar3 = (**(code **)(*(long *)this->model + 0x78))(this->model,local_48);
          } while ((int)uVar8 < iVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void UEFITool::goToData()
{
    QModelIndex index = ui->structureTreeView->selectionModel()->currentIndex();
    if (!index.isValid() || model->type(index) != Types::NvarEntry || model->subtype(index) != Subtypes::LinkNvarEntry)
        return;
    
    // Get parent
    QModelIndex parent = model->parent(index);
    
    for (int i = index.row(); i < model->rowCount(parent); i++) {
        if (model->hasEmptyParsingData(index))
            continue;
        
        UByteArray rdata = model->parsingData(index);
        const NVAR_ENTRY_PARSING_DATA* pdata = (const NVAR_ENTRY_PARSING_DATA*)rdata.constData();
        UINT32 offset = model->offset(index);
        if (pdata->next == 0xFFFFFF) {
            ui->structureTreeView->scrollTo(index, QAbstractItemView::PositionAtCenter);
            ui->structureTreeView->selectionModel()->select(index, QItemSelectionModel::Select | QItemSelectionModel::Rows | QItemSelectionModel::Clear);
        }
        
        for (int j = i + 1; j < model->rowCount(parent); j++) {
            QModelIndex currentIndex = parent.model()->index(j, 0, parent);
            
            if (model->hasEmptyParsingData(currentIndex))
                continue;
            
            if (model->offset(currentIndex) == offset + pdata->next) {
                index = currentIndex;
                break;
            }
        }
    }
}